

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::velocity_advection(NavierStokesBase *this,Real dt)

{
  Real RVar1;
  bool bVar2;
  MultiFab *pMVar3;
  NavierStokesBase *pNVar4;
  MFIter *mfi;
  FArrayBox *pFVar5;
  long *in_RDI;
  bool is_convective;
  Array4<const_double> *rho;
  Array4<const_double> *gp;
  Array4<const_double> *visc;
  Array4<double> *tf;
  Box force_bx;
  MFIter U_mfi_1;
  MultiFab visc_terms;
  MultiFab *dsdt;
  MultiFab *Smf;
  FillPatchIterator S_fpi;
  MultiFab *Gp;
  Array4<double> *st;
  Array4<const_double> *vel;
  Array4<const_double> *dens;
  Box state_bx;
  MFIter U_mfi;
  MultiFab *Rmf;
  FillPatchIterator Rho_fpi;
  MultiFab *S_term;
  MultiFab *Umf;
  FillPatchIterator U_fpi;
  MultiFab forcing_term;
  MultiFab *divu_fp;
  Real prev_time;
  char (*in_stack_ffffffffffffeac8) [23];
  undefined4 in_stack_ffffffffffffead0;
  undefined4 uVar6;
  int in_stack_ffffffffffffead4;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffead8;
  FabArray<amrex::FArrayBox> *this_00;
  FabArray<amrex::FArrayBox> *in_stack_ffffffffffffeae0;
  undefined8 in_stack_ffffffffffffeae8;
  MFInfo *in_stack_ffffffffffffeaf0;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_ffffffffffffeaf8;
  Print *in_stack_ffffffffffffeb00;
  AmrLevel *in_stack_ffffffffffffeb08;
  undefined1 *puVar7;
  FillPatchIterator *in_stack_ffffffffffffeb10;
  anon_class_192_3_eef7e2f2 *in_stack_ffffffffffffeb18;
  anon_class_264_5_66ebbdc0 *f;
  int in_stack_ffffffffffffeb20;
  int in_stack_ffffffffffffeb24;
  int iVar8;
  Box *in_stack_ffffffffffffeb28;
  FabArray<amrex::FArrayBox> *box;
  Real in_stack_ffffffffffffeb38;
  Print *in_stack_ffffffffffffeb40;
  undefined8 in_stack_ffffffffffffeb48;
  NavierStokesBase *in_stack_ffffffffffffeb50;
  MultiFab *local_1408;
  undefined1 local_1398 [64];
  undefined1 auStack_1358 [64];
  undefined1 auStack_1318 [64];
  undefined1 auStack_12d8 [64];
  byte local_1298;
  byte local_1289;
  undefined1 local_1288 [208];
  Print *local_11b8;
  FabArrayBase local_11b0;
  undefined1 local_fd4 [28];
  FabArray<amrex::FArrayBox> local_fb8;
  MultiFab *local_da8;
  MultiFab *local_da0;
  FillPatchIterator local_d98;
  MultiFab *local_b88;
  undefined1 local_b80 [64];
  undefined1 auStack_b40 [64];
  undefined1 auStack_b00 [64];
  undefined1 local_ac0 [64];
  undefined1 *local_a80;
  undefined1 local_a78 [64];
  undefined1 *local_a38;
  undefined1 local_a30 [64];
  undefined1 *local_9f0;
  MFIter local_9c8;
  MultiFab *local_968;
  FillPatchIterator local_960;
  byte local_749;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined1 local_711;
  MultiFab *local_710;
  MultiFab *local_708;
  MultiFab *local_700;
  Real in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff927;
  MultiFab *in_stack_fffffffffffff928;
  int in_stack_fffffffffffff934;
  MultiFab *in_stack_fffffffffffff938;
  int in_stack_fffffffffffff940;
  int in_stack_fffffffffffff944;
  NavierStokesBase *in_stack_fffffffffffff948;
  MultiFab *in_stack_fffffffffffff990;
  
  if (verbose != 0) {
    if (do_mom_diff == 0) {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeb00,(ostream *)in_stack_ffffffffffffeaf8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                 in_stack_ffffffffffffeac8);
      amrex::Print::~Print(in_stack_ffffffffffffeb40);
    }
    else {
      amrex::OutStream();
      amrex::Print::Print(in_stack_ffffffffffffeb00,(ostream *)in_stack_ffffffffffffeaf8);
      amrex::Print::operator<<
                ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                 (char (*) [20])in_stack_ffffffffffffeac8);
      amrex::Print::~Print(in_stack_ffffffffffffeb40);
    }
  }
  amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
            ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
             CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
             (size_type)in_stack_ffffffffffffeac8);
  RVar1 = amrex::StateData::prevTime((StateData *)in_stack_ffffffffffffeae0);
  nghost_force((NavierStokesBase *)0x52e789);
  pMVar3 = getDivCond(in_stack_ffffffffffffeb50,(int)((ulong)in_stack_ffffffffffffeb48 >> 0x20),
                      (Real)in_stack_ffffffffffffeb40);
  nghost_force((NavierStokesBase *)0x52e7d8);
  amrex::MFInfo::MFInfo((MFInfo *)0x52e813);
  pNVar4 = (NavierStokesBase *)
           amrex::AmrLevel::Factory
                     ((AmrLevel *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
  amrex::MultiFab::MultiFab
            ((MultiFab *)in_stack_ffffffffffffeb10,(BoxArray *)in_stack_ffffffffffffeb08,
             (DistributionMapping *)in_stack_ffffffffffffeb00,
             (int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20),(int)in_stack_ffffffffffffeaf8,
             in_stack_ffffffffffffeaf0,
             (FabFactory<amrex::FArrayBox> *)
             CONCAT44(in_stack_ffffffffffffeb24,in_stack_ffffffffffffeb20));
  amrex::MFInfo::~MFInfo((MFInfo *)0x52e86a);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            ((FabArray<amrex::FArrayBox> *)
             CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),(value_type)pNVar4);
  nghost_state(pNVar4);
  pNVar4 = (NavierStokesBase *)CONCAT44((int)((ulong)pNVar4 >> 0x20),3);
  amrex::FillPatchIterator::FillPatchIterator
            (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,
             (MultiFab *)in_stack_ffffffffffffeb00,(int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20),
             (Real)in_stack_ffffffffffffeaf0,(int)((ulong)in_stack_ffffffffffffeae8 >> 0x20),
             (int)in_stack_ffffffffffffeae8,in_stack_ffffffffffffeb20);
  local_1408 = amrex::FillPatchIterator::get_mf((FillPatchIterator *)&stack0xfffffffffffff908);
  local_711 = 0;
  local_749 = 0;
  local_700 = local_1408;
  if (do_mom_diff != 0) {
    local_1408 = (MultiFab *)operator_new(0x180);
    local_711 = 1;
    local_710 = local_1408;
    nghost_state(pNVar4);
    local_738 = 0;
    uStack_730 = 0;
    local_748 = 0;
    uStack_740 = 0;
    local_728 = 0;
    amrex::MFInfo::MFInfo((MFInfo *)0x52e99c);
    local_749 = 1;
    pNVar4 = (NavierStokesBase *)
             amrex::AmrLevel::Factory
                       ((AmrLevel *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffeb10,(BoxArray *)in_stack_ffffffffffffeb08,
               (DistributionMapping *)in_stack_ffffffffffffeb00,
               (int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20),(int)in_stack_ffffffffffffeaf8,
               in_stack_ffffffffffffeaf0,
               (FabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffeb24,in_stack_ffffffffffffeb20));
  }
  local_711 = 0;
  local_708 = local_1408;
  if ((local_749 & 1) != 0) {
    amrex::MFInfo::~MFInfo((MFInfo *)0x52ea41);
  }
  iVar8 = (int)((ulong)in_stack_ffffffffffffeb48 >> 0x20);
  if (do_mom_diff != 0) {
    nghost_state(pNVar4);
    pNVar4 = (NavierStokesBase *)CONCAT44((int)((ulong)pNVar4 >> 0x20),1);
    amrex::FillPatchIterator::FillPatchIterator
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,
               (MultiFab *)in_stack_ffffffffffffeb00,(int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20)
               ,(Real)in_stack_ffffffffffffeaf0,(int)((ulong)in_stack_ffffffffffffeae8 >> 0x20),
               (int)in_stack_ffffffffffffeae8,in_stack_ffffffffffffeb20);
    local_968 = amrex::FillPatchIterator::get_mf(&local_960);
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,
               SUB81((ulong)in_stack_ffffffffffffeaf0 >> 0x38,0));
    while( true ) {
      bVar2 = amrex::MFIter::isValid(&local_9c8);
      iVar8 = (int)((ulong)in_stack_ffffffffffffeb48 >> 0x20);
      if (!bVar2) break;
      nghost_state(pNVar4);
      amrex::MFIter::growntilebox
                ((MFIter *)in_stack_ffffffffffffeb40,(int)((ulong)in_stack_ffffffffffffeb38 >> 0x20)
                );
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffead8,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
      local_9f0 = local_a30;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffead8,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
      local_a38 = local_a78;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffead8,
                 (MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
      local_a80 = local_ac0;
      memcpy(local_b80,local_9f0,0x3c);
      memcpy(auStack_b40,local_a38,0x3c);
      memcpy(auStack_b00,local_a80,0x3c);
      amrex::ParallelFor<int,NavierStokesBase::velocity_advection(double)::__0,void>
                (in_stack_ffffffffffffeb28,in_stack_ffffffffffffeb24,in_stack_ffffffffffffeb18);
      amrex::MFIter::operator++(&local_9c8);
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
    amrex::FillPatchIterator::~FillPatchIterator
              ((FillPatchIterator *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
  }
  bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                          (char *)pNVar4);
  if (bVar2) {
    local_b88 = amrex::AmrLevel::get_old_data
                          ((AmrLevel *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0)
                           ,(int)((ulong)pNVar4 >> 0x20));
    nghost_force((NavierStokesBase *)0x52edc0);
    amrex::FillPatchIterator::FillPatchIterator
              (in_stack_ffffffffffffeb10,in_stack_ffffffffffffeb08,
               (MultiFab *)in_stack_ffffffffffffeb00,(int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20)
               ,(Real)in_stack_ffffffffffffeaf0,(int)((ulong)in_stack_ffffffffffffeae8 >> 0x20),
               (int)in_stack_ffffffffffffeae8,in_stack_ffffffffffffeb20);
    local_da0 = amrex::FillPatchIterator::get_mf(&local_d98);
    nghost_force((NavierStokesBase *)0x52ee2e);
    local_da8 = getDsdt(in_stack_ffffffffffffeb50,iVar8,(Real)in_stack_ffffffffffffeb40);
    nghost_force((NavierStokesBase *)0x52eeb9);
    amrex::MultiFab::Saxpy
              ((MultiFab *)in_stack_ffffffffffffeb10,(Real)in_stack_ffffffffffffeb08,
               (MultiFab *)in_stack_ffffffffffffeb00,(int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20)
               ,(int)in_stack_ffffffffffffeaf8,(int)((ulong)in_stack_ffffffffffffeaf0 >> 0x20),
               (int)in_stack_ffffffffffffeaf0);
    if (local_da8 != (MultiFab *)0x0) {
      (*(local_da8->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
    }
    nghost_force((NavierStokesBase *)0x52ef47);
    local_fb8.super_FabArrayBase.distributionMap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_fb8.super_FabArrayBase.distributionMap.m_ref.
    super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_fb8.super_FabArrayBase.boxarray.m_simplified_list.
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    local_fb8.super_FabArrayBase.boxarray.m_simplified_list.
    super___shared_ptr<amrex::BoxList,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_fb8.super_FabArrayBase.indexArray.super_vector<int,_std::allocator<int>_>.
    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    amrex::MFInfo::MFInfo((MFInfo *)0x52ef84);
    mfi = (MFIter *)
          amrex::AmrLevel::Factory
                    ((AmrLevel *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
    amrex::MultiFab::MultiFab
              ((MultiFab *)in_stack_ffffffffffffeb10,(BoxArray *)in_stack_ffffffffffffeb08,
               (DistributionMapping *)in_stack_ffffffffffffeb00,
               (int)((ulong)in_stack_ffffffffffffeaf8 >> 0x20),(int)in_stack_ffffffffffffeaf8,
               in_stack_ffffffffffffeaf0,
               (FabFactory<amrex::FArrayBox> *)
               CONCAT44(in_stack_ffffffffffffeb24,in_stack_ffffffffffffeb20));
    do_tiling_ = (undefined1)((ulong)in_stack_ffffffffffffeaf0 >> 0x38);
    amrex::MFInfo::~MFInfo((MFInfo *)0x52efdb);
    if ((be_cn_theta != 1.0) || (NAN(be_cn_theta))) {
      (**(code **)(*in_RDI + 0x198))
                (SUB84(RVar1,0),in_RDI,
                 &local_fb8.super_FabArrayBase.indexArray.super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_end_of_storage,0,3);
    }
    else {
      amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                ((FabArray<amrex::FArrayBox> *)
                 CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),(value_type)mfi);
    }
    amrex::TilingIfNotGPU();
    amrex::MFIter::MFIter
              ((MFIter *)in_stack_ffffffffffffeb00,in_stack_ffffffffffffeaf8,(bool)do_tiling_);
    while( true ) {
      iVar8 = (int)((ulong)in_stack_ffffffffffffeb38 >> 0x20);
      bVar2 = amrex::MFIter::isValid((MFIter *)&local_fb8);
      if (!bVar2) break;
      nghost_force((NavierStokesBase *)0x52f0f5);
      amrex::MFIter::growntilebox((MFIter *)in_stack_ffffffffffffeb40,iVar8);
      if (getForceVerbose != 0) {
        amrex::OutStream();
        amrex::Print::Print(in_stack_ffffffffffffeb00,(ostream *)in_stack_ffffffffffffeaf8);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                   (char (*) [4])mfi);
        local_11b0.boxarray.m_bat.m_op.m_bndryReg.m_doihi.vect[2]._3_1_ = 10;
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                   (char *)mfi);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                   (char (*) [24])mfi);
        local_11b0.boxarray.m_bat.m_op.m_bndryReg.m_doihi.vect[2]._2_1_ = 10;
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                   (char *)mfi);
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                   (char (*) [20])mfi);
        local_11b0.boxarray.m_bat.m_op.m_bndryReg.m_doihi.vect[2]._1_1_ = 10;
        amrex::Print::operator<<
                  ((Print *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),
                   (char *)mfi);
        amrex::Print::~Print(in_stack_ffffffffffffeb40);
      }
      this_00 = &local_fb8;
      pFVar5 = amrex::FabArray<amrex::FArrayBox>::operator[]
                         ((FabArray<amrex::FArrayBox> *)
                          CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),mfi);
      in_stack_ffffffffffffeb38 = RVar1;
      in_stack_ffffffffffffeb40 =
           (Print *)amrex::FabArray<amrex::FArrayBox>::operator[]
                              ((FabArray<amrex::FArrayBox> *)
                               CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),mfi);
      mfi = (MFIter *)
            amrex::FabArray<amrex::FArrayBox>::operator[]
                      ((FabArray<amrex::FArrayBox> *)
                       CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0),mfi);
      in_stack_ffffffffffffead0 = 0;
      box = this_00;
      (**(code **)(*in_RDI + 0x150))
                (SUB84(in_stack_ffffffffffffeb38,0),in_RDI,pFVar5,local_fd4,0,3,
                 in_stack_ffffffffffffeb40);
      in_stack_ffffffffffffeaf8 = &local_11b0;
      iVar8 = 0;
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffeae0,(MFIter *)this_00,in_stack_ffffffffffffead4);
      in_stack_ffffffffffffeb00 = (Print *)(local_1288 + 0x90);
      local_11b0.boxarray.m_bat.m_op._52_8_ = in_stack_ffffffffffffeaf8;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (in_stack_ffffffffffffeae0,(MFIter *)this_00,in_stack_ffffffffffffead4);
      puVar7 = local_1288 + 0x48;
      local_11b8 = in_stack_ffffffffffffeb00;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_00,(MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
      f = (anon_class_264_5_66ebbdc0 *)local_1288;
      local_1288._136_8_ = puVar7;
      amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (this_00,(MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
      local_1289 = -(do_mom_diff == 0) & 1;
      local_1288._64_8_ = f;
      memcpy(local_1398,(void *)local_11b0.boxarray.m_bat.m_op._52_8_,0x3c);
      memcpy(auStack_1358,local_11b8,0x3c);
      memcpy(auStack_1318,(void *)local_1288._136_8_,0x3c);
      memcpy(auStack_12d8,(void *)local_1288._64_8_,0x3c);
      local_1298 = local_1289 & 1;
      amrex::ParallelFor<int,NavierStokesBase::velocity_advection(double)::__1,void>
                ((Box *)box,iVar8,f);
      amrex::MFIter::operator++((MFIter *)&local_fb8);
    }
    amrex::MFIter::~MFIter((MFIter *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
    amrex::MultiFab::~MultiFab((MultiFab *)0x52f4b4);
    amrex::FillPatchIterator::~FillPatchIterator
              ((FillPatchIterator *)CONCAT44(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0));
  }
  uVar6 = 1;
  ComputeAofs(in_stack_fffffffffffff948,in_stack_fffffffffffff944,in_stack_fffffffffffff940,
              in_stack_fffffffffffff938,in_stack_fffffffffffff934,in_stack_fffffffffffff928,
              in_stack_fffffffffffff990,(bool)in_stack_fffffffffffff927,in_stack_fffffffffffff918);
  if (pMVar3 != (MultiFab *)0x0) {
    (*(pMVar3->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
  }
  if ((do_mom_diff != 0) && (local_708 != (MultiFab *)0x0)) {
    (*(local_708->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase[1])();
  }
  amrex::FillPatchIterator::~FillPatchIterator
            ((FillPatchIterator *)CONCAT44(in_stack_ffffffffffffead4,uVar6));
  amrex::MultiFab::~MultiFab((MultiFab *)0x52f58b);
  return;
}

Assistant:

void
NavierStokesBase::velocity_advection (Real dt)
{
    BL_PROFILE("NavierStokesBase::velocity_advection()");

    if (verbose)
    {
        if (do_mom_diff == 0)
        {

            amrex::Print() << "... advect velocities\n";
        }
        else
        {
            amrex::Print() << "... advect momenta\n";
        }
    }

    const Real  prev_time      = state[State_Type].prevTime();

    MultiFab* divu_fp = getDivCond(nghost_force(),prev_time);

    MultiFab forcing_term( grids, dmap, AMREX_SPACEDIM, nghost_force(), MFInfo(),Factory());
    forcing_term.setVal(0.0);

    FillPatchIterator U_fpi(*this,forcing_term, nghost_state(),prev_time,State_Type,Xvel,AMREX_SPACEDIM);
    MultiFab& Umf=U_fpi.get_mf();

    //
    // S_term is the state we are solving for: either velocity or momentum
    //
    MultiFab* S_term;

    S_term = (do_mom_diff)
        ? new MultiFab( grids, dmap, AMREX_SPACEDIM, nghost_state(), MFInfo(), Factory())
        : &Umf;

    if (do_mom_diff)
    {
        FillPatchIterator Rho_fpi(*this,forcing_term,nghost_state(),prev_time,State_Type,Density,1);
        MultiFab& Rmf=Rho_fpi.get_mf();

        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {
            auto const state_bx = U_mfi.growntilebox(nghost_state());

            auto const& dens = Rmf.const_array(U_mfi); //Previous time, nghost_state() grow cells filled
            auto const& vel  = Umf.const_array(U_mfi);
            auto const& st   = S_term->array(U_mfi);

            amrex::ParallelFor(state_bx, AMREX_SPACEDIM, [ dens, vel, st ]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { st(i,j,k,n) = vel(i,j,k,n) * dens(i,j,k); });
        }
    }

    //
    // Forcing term not used in MOL
    //
    if ( advection_scheme != "MOL" )
    {
        MultiFab& Gp = get_old_data(Gradp_Type);

        FillPatchIterator S_fpi(*this,forcing_term,nghost_force(),prev_time,State_Type,Density,NUM_SCALARS);
        MultiFab& Smf=S_fpi.get_mf();

	// Get divu to time n+1/2
        MultiFab* dsdt    = getDsdt(nghost_force(),prev_time);
        MultiFab::Saxpy(*divu_fp, 0.5*dt, *dsdt, 0, 0, 1, nghost_force());
        delete dsdt;

        MultiFab visc_terms(grids,dmap,AMREX_SPACEDIM,nghost_force(),MFInfo(),Factory());
        if (be_cn_theta != 1.0)
            getViscTerms(visc_terms,Xvel,AMREX_SPACEDIM,prev_time);
        else
            visc_terms.setVal(0.0);


#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter U_mfi(Umf,TilingIfNotGPU()); U_mfi.isValid(); ++U_mfi)
        {

            auto const force_bx = U_mfi.growntilebox(nghost_force()); // Box for forcing term

            if (getForceVerbose)
            {
                amrex::Print() << "---" << '\n'
                               << "B - velocity advection:" << '\n'
                               << "Calling getForce..." << '\n';
            }
            getForce(forcing_term[U_mfi],force_bx,Xvel,AMREX_SPACEDIM,
                     prev_time,Umf[U_mfi],Smf[U_mfi],0,U_mfi);

            //
            // Compute the total forcing.
            //
            auto const& tf   = forcing_term.array(U_mfi,Xvel);
            auto const& visc = visc_terms.const_array(U_mfi,Xvel);
            auto const& gp   = Gp.const_array(U_mfi);
            auto const& rho  = Smf.const_array(U_mfi); //Previous time, nghost_force() grow cells filled

            bool is_convective = do_mom_diff ? false : true;
            amrex::ParallelFor(force_bx, AMREX_SPACEDIM, [ tf, visc, gp, rho, is_convective]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            {
                tf(i,j,k,n) = ( tf(i,j,k,n) + visc(i,j,k,n) - gp(i,j,k,n) );
                if (is_convective)
                    tf(i,j,k,n) /= rho(i,j,k);
            });
        }
    }

    ComputeAofs( Xvel, AMREX_SPACEDIM, *S_term, 0, forcing_term, *divu_fp, true, dt );

    delete divu_fp;
    if (do_mom_diff)
        delete S_term;
}